

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O0

void aom_highbd_ssim_parms_8x8_c
               (uint16_t *s,int sp,uint16_t *r,int rp,uint32_t *sum_s,uint32_t *sum_r,
               uint32_t *sum_sq_s,uint32_t *sum_sq_r,uint32_t *sum_sxr)

{
  int j;
  int i;
  uint32_t *sum_r_local;
  uint32_t *sum_s_local;
  int rp_local;
  uint16_t *r_local;
  int sp_local;
  uint16_t *s_local;
  
  r_local = r;
  s_local = s;
  for (i = 0; i < 8; i = i + 1) {
    for (j = 0; j < 8; j = j + 1) {
      *sum_s = (uint)s_local[j] + *sum_s;
      *sum_r = (uint)r_local[j] + *sum_r;
      *sum_sq_s = (uint)s_local[j] * (uint)s_local[j] + *sum_sq_s;
      *sum_sq_r = (uint)r_local[j] * (uint)r_local[j] + *sum_sq_r;
      *sum_sxr = (uint)s_local[j] * (uint)r_local[j] + *sum_sxr;
    }
    s_local = s_local + sp;
    r_local = r_local + rp;
  }
  return;
}

Assistant:

void aom_highbd_ssim_parms_8x8_c(const uint16_t *s, int sp, const uint16_t *r,
                                 int rp, uint32_t *sum_s, uint32_t *sum_r,
                                 uint32_t *sum_sq_s, uint32_t *sum_sq_r,
                                 uint32_t *sum_sxr) {
  int i, j;
  for (i = 0; i < 8; i++, s += sp, r += rp) {
    for (j = 0; j < 8; j++) {
      *sum_s += s[j];
      *sum_r += r[j];
      *sum_sq_s += s[j] * s[j];
      *sum_sq_r += r[j] * r[j];
      *sum_sxr += s[j] * r[j];
    }
  }
}